

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *
create_message_disposition_info(AMQP_MESSENGER_INSTANCE_conflict *messenger)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  char *link_name;
  LOGGER_LOG l_1;
  LOGGER_LOG p_Stack_20;
  delivery_number message_id;
  LOGGER_LOG l;
  AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *result;
  AMQP_MESSENGER_INSTANCE_conflict *messenger_local;
  
  result = (AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *)messenger;
  l = (LOGGER_LOG)malloc(0x10);
  if (l == (LOGGER_LOG)0x0) {
    p_Stack_20 = xlogging_get_log_function();
    if (p_Stack_20 != (LOGGER_LOG)0x0) {
      (*p_Stack_20)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_message_disposition_info",0x2e0,1,
                    "Failed creating AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO container (malloc failed)"
                   );
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar1 = messagereceiver_get_received_message_id
                      ((MESSAGE_RECEIVER_HANDLE)result[5].source,(delivery_number *)((long)&l_1 + 4)
                      );
    if (iVar1 == 0) {
      iVar1 = messagereceiver_get_link_name((MESSAGE_RECEIVER_HANDLE)result[5].source,(char **)&l_2)
      ;
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s((char **)(l + 8),(char *)l_2);
        if (iVar1 == 0) {
          *(undefined4 *)l = l_1._4_4_;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"create_message_disposition_info",0x2f9,1,
                      "Failed creating AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO container (failed copying link name)"
                     );
          }
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_message_disposition_info",0x2f3,1,
                    "Failed creating AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO container (messagereceiver_get_link_name failed)"
                   );
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
    else {
      link_name = (char *)xlogging_get_log_function();
      if ((LOGGER_LOG)link_name != (LOGGER_LOG)0x0) {
        (*(code *)link_name)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"create_message_disposition_info",0x2e9,1,
                   "Failed creating AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO container (messagereceiver_get_received_message_id failed)"
                  );
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *)l;
}

Assistant:

static TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO* create_message_disposition_info(TELEMETRY_MESSENGER_INSTANCE* messenger)
{
    TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO* result;

    if ((result = (TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO*)malloc(sizeof(TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO))) == NULL)
    {
        LogError("Failed creating TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO container (malloc failed)");
        result = NULL;
    }
    else
    {
        delivery_number message_id;

        if (messagereceiver_get_received_message_id(messenger->message_receiver, &message_id) != RESULT_OK)
        {
            LogError("Failed creating TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO container (messagereceiver_get_received_message_id failed)");
            free(result);
            result = NULL;
        }
        else
        {
            const char* link_name;

            if (messagereceiver_get_link_name(messenger->message_receiver, &link_name) != RESULT_OK)
            {
                LogError("Failed creating TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO container (messagereceiver_get_link_name failed)");
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->source, link_name) != RESULT_OK)
            {
                LogError("Failed creating TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO container (failed copying link name)");
                free(result);
                result = NULL;
            }
            else
            {
                result->message_id = message_id;
            }
        }
    }

    return result;
}